

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

meta_redirect_type_enum ctemplate_htmlparser::meta_redirect_type(char *value)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  
  if (value != (char *)0x0) {
    pbVar4 = (byte *)(value + 6);
    while( true ) {
      bVar1 = pbVar4[-6];
      if (((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         (9 < (byte)(bVar1 - 0x30))) break;
      pbVar4 = pbVar4 + 1;
    }
    if (bVar1 == 0x3b) {
      while (((ulong)pbVar4[-5] < 0x21 && ((0x100002600U >> ((ulong)pbVar4[-5] & 0x3f) & 1) != 0)))
      {
        pbVar4 = pbVar4 + 1;
      }
      iVar2 = strncasecmp((char *)(pbVar4 + -5),"url",3);
      if (iVar2 == 0) {
        for (; uVar3 = (ulong)pbVar4[-2], uVar3 < 0x3e; pbVar4 = pbVar4 + 1) {
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
            if (uVar3 != 0x3d) {
              return META_REDIRECT_TYPE_NONE;
            }
            goto LAB_0012f6c2;
          }
        }
      }
    }
  }
  return META_REDIRECT_TYPE_NONE;
LAB_0012f6c2:
  bVar1 = pbVar4[-1];
  uVar3 = (ulong)bVar1;
  if (0x27 < uVar3) {
LAB_0012f6e9:
    return META_REDIRECT_TYPE_URL - (bVar1 == 0);
  }
  if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
    if ((0x8400000000U >> (uVar3 & 0x3f) & 1) != 0) {
      bVar1 = *pbVar4;
    }
    goto LAB_0012f6e9;
  }
  pbVar4 = pbVar4 + 1;
  goto LAB_0012f6c2;
}

Assistant:

enum meta_redirect_type_enum meta_redirect_type(const char *value) {

  if (value == NULL)
    return META_REDIRECT_TYPE_NONE;

  /* Match while [ \t\r\n0-9]* */
  value = ignore_spaces_or_digits(value);

  /* Verify that we got a semi-colon character */
  if (*value != ';')
    return META_REDIRECT_TYPE_NONE;
  value++;

  /* Match while [ \t\r\n]* */
  value = ignore_spaces(value);

  /* Validate that we have 'URL' */
  if (strncasecmp(value, "url", strlen("url")) != 0)
    return META_REDIRECT_TYPE_NONE;

  value += strlen("url");

  /* Match while [ \t\r\n]* */
  value = ignore_spaces(value);

  if (*value != '=')
    return META_REDIRECT_TYPE_NONE;
  value++;

  /* Match while [ \t\r\n]* */
  value = ignore_spaces(value);

  /* The HTML5 spec allows for the url to be quoted, so we skip a single or
   * double quote if we find one.
   */
  if (*value == '"' || *value == '\'')
    value++;

  if (*value == '\0')
    return META_REDIRECT_TYPE_URL_START;
  else
    return META_REDIRECT_TYPE_URL;
}